

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O3

PSprite __thiscall SpriteBase::get_masked(SpriteBase *this,PSprite *mask)

{
  uint uVar1;
  _func_int ***ppp_Var2;
  int iVar3;
  undefined4 extraout_var;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  ExceptionFreeserf *this_00;
  shared_ptr<Data::Sprite> *in_RDX;
  size_t x;
  long lVar7;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  undefined1 auVar11 [16];
  PSprite PVar12;
  undefined1 local_79;
  ulong local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  element_type *local_60;
  SpriteBase *local_58;
  string local_50;
  undefined4 extraout_var_00;
  
  iVar3 = (*((in_RDX->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Sprite[1])();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar3) <=
      mask[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    std::__shared_ptr<SpriteBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<SpriteBase>,std::shared_ptr<Data::Sprite>&>
              ((__shared_ptr<SpriteBase,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (allocator<SpriteBase> *)&local_79,in_RDX);
    (this->super_Sprite)._vptr_Sprite = (_func_int **)local_50._M_dataplus._M_p;
    local_60 = (element_type *)local_50._M_string_length;
    (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
    super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_50._M_string_length;
    puVar4 = (uint *)(**(code **)*(_func_int **)local_50._M_dataplus._M_p)
                               (local_50._M_dataplus._M_p);
    local_70 = mask[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    local_68 = mask[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    lVar7 = (long)mask[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr *
            (long)local_70;
    local_78 = (**(code **)(*(_func_int **)local_50._M_dataplus._M_p + 8))
                         (local_50._M_dataplus._M_p);
    local_58 = this;
    iVar3 = (**((in_RDX->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               _vptr_Sprite)();
    puVar5 = (uint *)CONCAT44(extraout_var_00,iVar3);
    ppp_Var2 = &local_68->_vptr__Sp_counted_base;
    local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_70 - local_78);
    uVar6 = 0;
    p_Var9 = local_68;
    while( true ) {
      auVar11 = (**(code **)(*(_func_int **)local_50._M_dataplus._M_p + 0x10))
                          (local_50._M_dataplus._M_p);
      PVar12.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           auVar11._8_8_;
      if (auVar11._0_8_ <= uVar6) break;
      uVar8 = 0;
      local_78 = uVar6;
      while( true ) {
        uVar6 = (**(code **)(*(_func_int **)local_50._M_dataplus._M_p + 8))
                          (local_50._M_dataplus._M_p);
        if (uVar6 <= uVar8) break;
        p_Var10 = p_Var9;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)ppp_Var2 + lVar7 * 4) <= p_Var9)
        {
          p_Var10 = local_68;
        }
        uVar1 = *puVar5;
        puVar5 = puVar5 + 1;
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var10->_vptr__Sp_counted_base + 4);
        *puVar4 = uVar1 & *(uint *)&p_Var10->_vptr__Sp_counted_base;
        puVar4 = puVar4 + 1;
        uVar8 = uVar8 + 1;
      }
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var9->_vptr__Sp_counted_base + (long)local_70 * 4);
      uVar6 = local_78 + 1;
    }
    PVar12.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_58->super_Sprite;
    return (PSprite)PVar12.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Failed to apply mask to sprite","");
  ExceptionFreeserf::ExceptionFreeserf(this_00,&local_50);
  __cxa_throw(this_00,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

Data::PSprite
SpriteBase::get_masked(Data::PSprite mask) {
  if (mask->get_width() > width) {
    throw ExceptionFreeserf("Failed to apply mask to sprite");
  }

  Data::PSprite masked = std::make_shared<SpriteBase>(mask);

  uint32_t *pos = reinterpret_cast<uint32_t*>(masked->get_data());

  uint32_t *s_beg = reinterpret_cast<uint32_t*>(data);
  uint32_t *s_pos = s_beg;
  uint32_t *s_end = s_beg + (width * height);
  size_t s_delta = width - masked->get_width();

  uint32_t *m_pos = reinterpret_cast<uint32_t*>(mask->get_data());

  for (size_t y = 0; y < masked->get_height(); y++) {
    for (size_t x = 0; x < masked->get_width(); x++) {
      if (s_pos >= s_end) {
        s_pos = s_beg;
      }
      *pos++ = *s_pos++ & *m_pos++;
    }
    s_pos += s_delta;
  }

  return masked;
}